

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkview.c
# Opt level: O2

_Bool XPKView_LoadXPKEntry(void)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  int iVar5;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 uVar6;
  undefined8 in_RAX;
  uint8_t *rgba;
  char *pcVar7;
  undefined8 uVar8;
  LPStatus status;
  
  status = (LPStatus)((ulong)in_RAX >> 0x20);
  if (app.xpkentry_tx != (SDL_Texture *)0x0) {
    SDL_DestroyTexture();
  }
  app.xpkentry = XPK_EntryAtIndex(app.xpk,app.which_entry);
  rgba = XPKEntry_Decode(app.xpkentry,&status);
  iVar5 = app.which_entry;
  if (status == LUNAPURPURA_OK) {
    uVar8 = SDL_CreateRGBSurfaceWithFormatFrom
                      (rgba,(app.xpkentry)->width,(app.xpkentry)->height,0x20,
                       (uint)(app.xpkentry)->width * 4,0x16762004);
    app.xpkentry_tx = (SDL_Texture *)SDL_CreateTextureFromSurface(app.renderer,uVar8);
    SDL_FreeSurface(uVar8);
    XPKDecoder_FreeRGBA(rgba);
    uVar1._0_2_ = (app.xpkentry)->width;
    uVar1._2_2_ = (app.xpkentry)->height;
    uVar1._4_2_ = (app.xpkentry)->x;
    uVar1._6_2_ = (app.xpkentry)->y;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2._12_2_ = uVar1._6_2_;
    auVar3._8_2_ = uVar1._4_2_;
    auVar3._0_8_ = uVar1;
    auVar3._10_4_ = auVar2._10_4_;
    auVar4._6_8_ = 0;
    auVar4._0_6_ = auVar3._8_6_;
    app.entry_rect.y = auVar2._10_4_ >> 0x10;
    app.entry_rect.x = auVar3._8_4_;
    app.entry_rect.w._0_2_ = (undefined2)uVar1;
    app.entry_rect.w._2_2_ = 0;
    app.entry_rect.h = (int)CONCAT82(SUB148(auVar4 << 0x40,6),uVar1._2_2_);
    XPKView_ToggleCentered();
    XPKView_ToggleCentered();
    uVar6 = extraout_AL_00;
  }
  else {
    pcVar7 = LPStatusString(status);
    LPWarn("xpkview","Couldn\'t decode XPK entry #%d! - %s",(ulong)(uint)iVar5,pcVar7);
    uVar6 = extraout_AL;
  }
  return (_Bool)uVar6;
}

Assistant:

static bool
XPKView_LoadXPKEntry(void)
{
	if (app.xpkentry_tx) SDL_DestroyTexture(app.xpkentry_tx);

	app.xpkentry = XPK_EntryAtIndex(app.xpk, app.which_entry);

	LPStatus status;
	uint8_t *rgba = XPKEntry_Decode(app.xpkentry, &status);

	if (status != LUNAPURPURA_OK) {
		LPWarn(MSGPREFIX, "Couldn't decode XPK entry #%d! - %s", app.which_entry, LPStatusString(status));
		return false;
	}

	SDL_Surface *surf = SDL_CreateRGBSurfaceWithFormatFrom(
		rgba, app.xpkentry->width, app.xpkentry->height, 32, app.xpkentry->width*4, SDL_PIXELFORMAT_RGBA32
	);
	app.xpkentry_tx = SDL_CreateTextureFromSurface(app.renderer, surf);
	SDL_FreeSurface(surf);
	XPKDecoder_FreeRGBA(rgba);

	app.entry_rect.x = app.xpkentry->x;
	app.entry_rect.y = app.xpkentry->y;
	app.entry_rect.w = app.xpkentry->width;
	app.entry_rect.h = app.xpkentry->height;

	/* Do this twice on purpose so that we preserve the current setting. */
	XPKView_ToggleCentered();
	XPKView_ToggleCentered();

	return true;
}